

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer.cpp
# Opt level: O2

Layer * ncnn::create_layer(int index)

{
  Layer *pLVar1;
  Layer_final *this;
  
  pLVar1 = create_layer_cpu(index);
  if (pLVar1 == (Layer *)0x0) {
    this = (Layer_final *)0x0;
  }
  else {
    this = (Layer_final *)operator_new(0xd8);
    Layer_final::Layer_final(this);
    this->layer_cpu = pLVar1;
    (this->super_Layer).typeindex = index;
    Layer_final::set_layer_properties(this);
    Layer_final::get_layer_properties(this);
  }
  return &this->super_Layer;
}

Assistant:

Layer* create_layer(int index)
{
    Layer* layer_cpu = create_layer_cpu(index);
    if (!layer_cpu)
        return 0;

    Layer_final* layer_final = new Layer_final;
    layer_final->layer_cpu = layer_cpu;

#if NCNN_VULKAN
    layer_final->layer_vulkan = create_layer_vulkan(index);
#endif

    layer_final->typeindex = index;
    layer_final->set_layer_properties();
    layer_final->get_layer_properties();

    return layer_final;
}